

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::Directory::SetProperty(Directory *this,string *prop,char *value,cmListFileBacktrace *lfbt)

{
  cmListFileBacktrace *pcVar1;
  bool bVar2;
  PointerType pBVar3;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  cmListFileBacktrace *local_28;
  cmListFileBacktrace *lfbt_local;
  char *value_local;
  string *prop_local;
  Directory *this_local;
  
  local_28 = lfbt;
  lfbt_local = (cmListFileBacktrace *)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  pcVar1 = lfbt_local;
  if (bVar2) {
    if (lfbt_local == (cmListFileBacktrace *)0x0) {
      ClearIncludeDirectories(this);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,(char *)pcVar1,&local_49);
      SetIncludeDirectories(this,&local_48,lfbt);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"COMPILE_OPTIONS");
    pcVar1 = lfbt_local;
    if (bVar2) {
      if (lfbt_local == (cmListFileBacktrace *)0x0) {
        ClearCompileOptions(this);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80,(char *)pcVar1,&local_81);
        SetCompileOptions(this,&local_80,lfbt);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"COMPILE_DEFINITIONS");
      pcVar1 = lfbt_local;
      if (bVar2) {
        if (lfbt_local == (cmListFileBacktrace *)0x0) {
          ClearCompileDefinitions(this);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a8,(char *)pcVar1,&local_a9);
          SetCompileDefinitions(this,&local_a8,lfbt);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
      }
      else {
        pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        cmPropertyMap::SetProperty(&pBVar3->Properties,(string *)value_local,(char *)lfbt_local);
      }
    }
  }
  return;
}

Assistant:

void cmState::Directory::SetProperty(const std::string& prop,
                                     const char* value,
                                     cmListFileBacktrace lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    if (!value)
      {
      this->ClearIncludeDirectories();
      return;
      }
    this->SetIncludeDirectories(value, lfbt);
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    if (!value)
      {
      this->ClearCompileOptions();
      return;
      }
    this->SetCompileOptions(value, lfbt);
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    if (!value)
      {
      this->ClearCompileDefinitions();
      return;
      }
    this->SetCompileDefinitions(value, lfbt);
    return;
    }

  this->DirectoryState->Properties.SetProperty(prop, value);
}